

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O1

void __kmp_dispatch_init<long_long>
               (ident_t *loc,int gtid,sched_type schedule,longlong lb,longlong ub,
               signed_t_conflict st,signed_t_conflict chunk,int push_ws)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  kmp_info_t *pkVar4;
  kmp_team_p *pkVar5;
  ident_t *piVar6;
  bool bVar7;
  sched_type *psVar8;
  code *pcVar9;
  ulong uVar10;
  kmp_info_t *pkVar11;
  long lVar12;
  code *pcVar13;
  kmp_disp_t *pkVar14;
  kmp_disp_t *pkVar15;
  kmp_disp_t *extraout_RDX;
  kmp_disp_t *extraout_RDX_00;
  kmp_disp_t *extraout_RDX_01;
  kmp_disp_t *pkVar16;
  kmp_disp_t *extraout_RDX_02;
  kmp_disp_t *extraout_RDX_03;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  cons_type ct;
  ulong uVar20;
  kmp_uint64 sched_type;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  sched_type sVar24;
  sched_type sVar25;
  dispatch_private_info_t *pdVar26;
  bool bVar27;
  bool bVar28;
  longdouble lVar29;
  longdouble lVar30;
  longdouble lVar31;
  longdouble lVar32;
  longdouble lVar33;
  uint local_110;
  kmp_disp_t *local_f8;
  kmp_disp_t *local_e8;
  dispatch_shared_info_t *local_a0;
  kmp_msg_t local_78;
  kmp_msg_t local_60;
  kmp_msg_t local_48;
  
  if (__kmp_init_parallel == 0) {
    __kmp_parallel_initialize();
  }
  pkVar11 = (kmp_info_t *)__kmp_threads;
  pkVar4 = __kmp_threads[gtid];
  pkVar5 = (pkVar4->th).th_team;
  iVar2 = (pkVar5->t).t_serialized;
  (pkVar4->th).th_ident = loc;
  bVar28 = false;
  if ((__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0) &&
     (__kmp_forkjoin_frames_mode == 3)) {
    pkVar11 = *(kmp_info_t **)((long)pkVar11 + (long)gtid * 8);
    if ((*(int *)(pkVar11->th_pad + 0x20) == 0) &&
       ((pkVar4->th).th_teams_microtask == (microtask_t)0x0)) {
      bVar28 = (pkVar5->t).t_active_level == 1;
      pkVar11 = (kmp_info_t *)CONCAT71((int7)((ulong)pkVar11 >> 8),bVar28);
    }
    else {
      bVar28 = false;
    }
  }
  local_110 = (uint)pkVar11;
  pkVar16 = (pkVar4->th).th_dispatch;
  if (iVar2 == 0) {
    local_110 = pkVar16->th_disp_index;
    pkVar16->th_disp_index = local_110 + 1;
    pkVar16 = (kmp_disp_t *)((ulong)local_110 % (ulong)(uint)__kmp_dispatch_num_buffers);
    pdVar26 = ((pkVar4->th).th_dispatch)->th_disp_buffer + (long)pkVar16;
    local_a0 = (pkVar5->t).t_disp_buffer + (long)pkVar16;
  }
  else {
    pdVar26 = pkVar16->th_disp_buffer;
  }
  sVar24 = schedule & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
  if (sVar24 - kmp_nm_lower < 0x28) {
    pdVar26->nomerge = 1;
    sVar24 = sVar24 - 0x80;
  }
  else {
    pdVar26->nomerge = 0;
  }
  pdVar26->type_size = 8;
  if ((sVar24 & kmp_ord_lower) == 0) {
    pdVar26->ordered = 0;
  }
  else {
    pdVar26->ordered = 1;
    sVar24 = sVar24 - kmp_sch_lower;
  }
  if (sVar24 == kmp_sch_runtime) {
    sVar25 = (pkVar5->t).t_sched.r_sched_type;
    if (sVar25 == kmp_sch_default) {
      psVar8 = &__kmp_static;
LAB_00156214:
      sVar25 = *psVar8;
    }
    else if (sVar25 == kmp_sch_guided_chunked) {
      psVar8 = &__kmp_guided;
      goto LAB_00156214;
    }
    chunk = (signed_t_conflict)(pkVar5->t).t_sched.chunk;
    local_e8 = (kmp_disp_t *)chunk;
LAB_00156222:
    if (sVar25 == kmp_sch_auto) {
      sVar25 = __kmp_auto;
    }
    if ((0x100000 < (pkVar5->t).t_nproc) && (sVar25 == kmp_sch_guided_analytical_chunked)) {
      __kmp_msg_format(&local_48,kmp_i18n_msg_DispatchManyThreads);
      __kmp_msg(kmp_ms_warning);
      sVar25 = kmp_sch_guided_iterative_chunked;
      pkVar16 = extraout_RDX;
    }
    (pdVar26->u).p64.field_6.parm1 = (kmp_int64)local_e8;
    local_f8 = (kmp_disp_t *)chunk;
  }
  else {
    sVar25 = __kmp_guided;
    if ((sVar24 == kmp_sch_guided_chunked) || (sVar25 = sVar24, sVar24 != kmp_sch_default)) {
      local_e8 = (kmp_disp_t *)0x1;
      if (1 < chunk) {
        local_e8 = (kmp_disp_t *)chunk;
      }
      goto LAB_00156222;
    }
    local_f8 = (kmp_disp_t *)chunk;
    local_e8 = (kmp_disp_t *)chunk;
    sVar25 = __kmp_static;
  }
  uVar1 = sVar25 - kmp_sch_static_chunked;
  if (0xc < uVar1) {
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-openmp-runtime/src/kmp_dispatch.cpp"
                       ,0x2ff);
    pkVar16 = extraout_RDX_00;
  }
  (pdVar26->u).p64.count = 0;
  if ((st == 0) && (__kmp_env_consistency_check != 0)) {
    __kmp_error_construct
              (kmp_i18n_msg_CnsLoopIncrZeroProhibited,ct_pdo_ordered - (pdVar26->ordered == 0),loc);
    pkVar16 = extraout_RDX_01;
  }
  if (st == 1) {
    uVar23 = ub - lb;
    if (ub < lb) goto LAB_00156341;
LAB_0015635a:
    uVar23 = uVar23 + 1;
  }
  else {
    if (st < 0) {
      if (lb < ub) goto LAB_00156341;
      uVar23 = (ulong)(lb - ub) / (ulong)-st;
      pkVar16 = (kmp_disp_t *)((ulong)(lb - ub) % (ulong)-st);
      goto LAB_0015635a;
    }
    if (lb <= ub) {
      uVar23 = (ulong)(ub - lb) / (ulong)st;
      pkVar16 = (kmp_disp_t *)((ulong)(ub - lb) % (ulong)st);
      goto LAB_0015635a;
    }
LAB_00156341:
    uVar23 = 0;
  }
  (pdVar26->u).p64.lb = lb;
  (pdVar26->u).p64.ub = ub;
  (pdVar26->u).p64.st = st;
  (pdVar26->u).p64.tc = uVar23;
  if (iVar2 == 0) {
    if (pdVar26->ordered == 0) {
      pcVar9 = __kmp_dispatch_dxo_error;
      pcVar13 = __kmp_dispatch_deo_error;
    }
    else {
      pdVar26->ordered_bumped = 0;
      (pdVar26->u).p64.ordered_lower = 1;
      (pdVar26->u).p64.ordered_upper = 0;
      pcVar9 = __kmp_dispatch_dxo<unsigned_long_long>;
      pcVar13 = __kmp_dispatch_deo<unsigned_long_long>;
    }
    pkVar16 = (pkVar4->th).th_dispatch;
    pkVar16->th_deo_fcn = pcVar13;
    ((pkVar4->th).th_dispatch)->th_dxo_fcn = pcVar9;
  }
  if (__kmp_env_consistency_check != 0) {
    ct = ct_pdo_ordered - (pdVar26->ordered == 0);
    if (push_ws == 0) {
      __kmp_check_workshare(gtid,ct,loc);
      ct = ct_none;
      pkVar16 = extraout_RDX_03;
    }
    else {
      __kmp_push_workshare(gtid,ct,loc);
      pkVar16 = extraout_RDX_02;
    }
    pdVar26->pushed_ws = ct;
  }
  if (0xb < uVar1) {
switchD_0015644e_caseD_1:
    __kmp_msg_format(&local_60,kmp_i18n_msg_UnknownSchedTypeDetected);
    __kmp_msg_format(&local_78,kmp_i18n_hnt_GetNewerLibrary);
    pkVar14 = (kmp_disp_t *)__kmp_msg_null._16_8_;
    __kmp_msg(kmp_ms_fatal);
    goto LAB_00156783;
  }
  pkVar14 = (kmp_disp_t *)
            ((long)&switchD_0015644e::switchdataD_0016d628 +
            (long)(int)(&switchD_0015644e::switchdataD_0016d628)[uVar1]);
  switch(uVar1) {
  case 0:
  case 2:
    if ((pdVar26->u).p64.field_6.parm1 < 1) {
      (pdVar26->u).p64.field_6.parm1 = 1;
    }
    goto LAB_00156783;
  default:
    goto switchD_0015644e_caseD_1;
  case 6:
    pkVar14 = (kmp_disp_t *)((long)uVar23 / ((long)(pkVar5->t).t_nproc * 2));
    if ((long)pkVar14 < 2) {
      pkVar14 = (kmp_disp_t *)0x1;
    }
    pkVar16 = pkVar14;
    if ((long)local_e8 < (long)pkVar14) {
      pkVar16 = local_e8;
    }
    if ((long)local_e8 < 1) {
      pkVar16 = (kmp_disp_t *)0x1;
    }
    lVar12 = (long)&pkVar14->th_deo_fcn + (long)&pkVar16->th_deo_fcn;
    lVar12 = (long)(lVar12 + uVar23 * 2 + -1) / lVar12;
    lVar22 = 2;
    if (2 < lVar12) {
      lVar22 = lVar12;
    }
    (pdVar26->u).p64.field_6.parm1 = (kmp_int64)pkVar16;
    (pdVar26->u).p64.field_6.parm2 = (kmp_int64)pkVar14;
    (pdVar26->u).p64.field_6.parm3 = lVar22;
    (pdVar26->u).p64.field_6.parm4 = ((long)pkVar14 - (long)pkVar16) / (lVar22 + -1);
    sVar25 = kmp_sch_trapezoidal;
    goto LAB_00156783;
  case 7:
    pkVar14 = (kmp_disp_t *)(long)(pkVar5->t).t_nproc;
    uVar10 = uVar23;
    if (1 < (long)pkVar14) {
      uVar10 = (long)((long)pkVar14 + (uVar23 - 1)) / (long)pkVar14;
    }
    (pdVar26->u).p64.field_6.parm1 = uVar10;
    goto LAB_00156773;
  case 8:
    break;
  case 9:
    iVar3 = (pkVar5->t).t_nproc;
    lVar12 = (long)iVar3;
    if (1 < lVar12) {
      pkVar14 = (kmp_disp_t *)(((long)local_e8 * 2 + 1) * lVar12);
      sVar25 = kmp_sch_dynamic_chunked;
      if ((long)pkVar14 < (long)uVar23) {
        pkVar14 = (kmp_disp_t *)(((long)local_e8 * 2 + 2) * lVar12);
        (pdVar26->u).p64.field_6.parm2 = (kmp_int64)pkVar14;
        *(double *)((long)&pdVar26->u + 0x50) = 0.5 / (double)iVar3;
        sVar25 = kmp_sch_guided_iterative_chunked;
      }
      goto LAB_00156783;
    }
    goto LAB_00156629;
  case 10:
    iVar3 = (pkVar5->t).t_nproc;
    if (1 < (long)iVar3) {
      pkVar14 = (kmp_disp_t *)(((long)local_e8 * 2 + 1) * (long)iVar3);
      sVar25 = kmp_sch_dynamic_chunked;
      if ((long)uVar23 <= (long)pkVar14) goto LAB_00156783;
      lVar33 = (longdouble)-0.5 / (longdouble)iVar3 + (longdouble)1;
      *(longdouble *)((long)&pdVar26->u + 0x50) = lVar33;
      uVar10 = 0xe5;
      lVar29 = lVar33;
      lVar32 = (longdouble)1;
      do {
        lVar30 = lVar32 * lVar29;
        if ((uVar10 & 1) == 0) {
          lVar30 = lVar32;
        }
        lVar29 = lVar29 * lVar29;
        bVar7 = 1 < uVar10;
        uVar10 = uVar10 >> 1;
        lVar32 = lVar30;
      } while (bVar7);
      lVar29 = (((longdouble)1 + (longdouble)(long)local_e8 + (longdouble)(long)local_e8) *
               (longdouble)iVar3) / (longdouble)(long)uVar23;
      if (lVar30 <= lVar29) {
        uVar10 = 0xe5;
        uVar20 = 0;
      }
      else {
        uVar10 = 0xe5;
        do {
          uVar20 = uVar10;
          lVar30 = lVar30 * lVar30;
          uVar10 = uVar20 * 2;
          if (lVar30 <= lVar29) break;
        } while (uVar10 < 0x8000000);
        uVar20 = uVar20 & 0x7fffffffffffffff;
      }
      while (uVar18 = uVar20, uVar18 + 1 < uVar10) {
        uVar17 = uVar10 + uVar18 >> 1;
        lVar32 = (longdouble)1;
        if (1 < uVar10 + uVar18) {
          lVar32 = (longdouble)1;
          uVar20 = uVar17;
          lVar30 = lVar33;
          do {
            lVar31 = lVar32 * lVar30;
            if ((uVar20 & 1) == 0) {
              lVar31 = lVar32;
            }
            lVar32 = lVar31;
            lVar30 = lVar30 * lVar30;
            bVar7 = 1 < uVar20;
            uVar20 = uVar20 >> 1;
          } while (bVar7);
        }
        uVar20 = uVar17;
        if (lVar32 <= lVar29) {
          uVar20 = uVar18;
          uVar10 = uVar17;
        }
      }
      if (uVar10 == 0) {
LAB_00156af4:
        __kmp_debug_assert("assertion failure",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-openmp-runtime/src/kmp_dispatch.cpp"
                           ,0x42b);
      }
      else {
        lVar32 = (longdouble)1;
        if (uVar10 - 1 != 0) {
          lVar32 = (longdouble)1;
          uVar20 = uVar10 - 1;
          lVar30 = lVar33;
          do {
            lVar31 = lVar32 * lVar30;
            if ((uVar20 & 1) == 0) {
              lVar31 = lVar32;
            }
            lVar32 = lVar31;
            lVar30 = lVar30 * lVar30;
            bVar7 = 1 < uVar20;
            uVar20 = uVar20 >> 1;
          } while (bVar7);
        }
        if (lVar32 <= lVar29) goto LAB_00156af4;
        uVar20 = uVar10;
        lVar32 = lVar33;
        lVar30 = (longdouble)1;
        do {
          lVar31 = lVar30 * lVar32;
          if ((uVar20 & 1) == 0) {
            lVar31 = lVar30;
          }
          lVar32 = lVar32 * lVar32;
          bVar7 = 1 < uVar20;
          uVar20 = uVar20 >> 1;
          lVar30 = lVar31;
        } while (bVar7);
        if (lVar29 < lVar31) goto LAB_00156af4;
      }
      (pdVar26->u).p64.field_6.parm2 = uVar10;
      lVar29 = (longdouble)1;
      if (uVar10 != 0) {
        lVar29 = (longdouble)1;
        uVar20 = uVar10;
        do {
          lVar32 = lVar29 * lVar33;
          if ((uVar20 & 1) == 0) {
            lVar32 = lVar29;
          }
          lVar29 = lVar32;
          lVar33 = lVar33 * lVar33;
          bVar7 = 1 < uVar20;
          uVar20 = uVar20 >> 1;
        } while (bVar7);
      }
      lVar29 = lVar29 * (longdouble)(long)uVar23;
      lVar33 = (longdouble)9.223372e+18;
      lVar32 = (longdouble)0;
      if (lVar33 <= lVar29) {
        lVar32 = lVar33;
      }
      uVar20 = (ulong)(lVar33 <= lVar29) << 0x3f ^ (long)ROUND(lVar29 - lVar32);
      pkVar14 = (kmp_disp_t *)
                (ulong)(lVar29 !=
                       (longdouble)(long)uVar20 +
                       (longdouble)*(float *)(&DAT_0016d568 + (ulong)((long)uVar20 < 0) * 4));
      (pdVar26->u).p64.count = (uVar23 - (uVar10 * (long)local_e8 + uVar20)) - (long)pkVar14;
      sVar25 = kmp_sch_guided_analytical_chunked;
      goto LAB_00156783;
    }
LAB_00156629:
    (pdVar26->u).p64.field_6.parm1 = uVar23;
LAB_00156773:
    sVar25 = kmp_sch_static_greedy;
    goto LAB_00156783;
  case 0xb:
    iVar3 = (pkVar5->t).t_nproc;
    uVar20 = (ulong)iVar3;
    uVar10 = ((long)uVar23 / (long)local_e8 + 1) - (ulong)((long)uVar23 % (long)local_e8 == 0);
    bVar7 = iVar3 < 2;
    pkVar16 = (kmp_disp_t *)CONCAT71((int7)((ulong)((long)uVar23 % (long)local_e8) >> 8),bVar7);
    bVar27 = (long)uVar10 < (long)uVar20;
    pkVar14 = (kmp_disp_t *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),bVar27 || bVar7);
    sVar25 = kmp_sch_static_balanced;
    if (!bVar27 && !bVar7) {
      uVar21 = (ulong)*(int *)(__kmp_threads[gtid]->th_pad + 0x20);
      uVar17 = uVar10 % uVar20;
      uVar18 = uVar17;
      if ((long)uVar21 <= (long)uVar17) {
        uVar18 = uVar21;
      }
      pkVar16 = (kmp_disp_t *)(uVar18 + (uVar10 / uVar20) * uVar21);
      (pdVar26->u).p64.count = (kmp_int64)pkVar16;
      (pdVar26->u).p64.ub =
           (long)&pkVar16->th_deo_fcn + (ulong)((long)uVar21 < (long)uVar17) + uVar10 / uVar20;
      (pdVar26->u).p64.field_6.parm2 = lb;
      (pdVar26->u).p64.field_6.parm4 = uVar21;
      (pdVar26->u).p64.st = st;
      sVar25 = kmp_sch_static_steal;
    }
    if (!bVar27 && !bVar7) goto LAB_00156783;
  }
  uVar10 = (ulong)(pkVar5->t).t_nproc;
  if ((long)uVar10 < 2) {
    if ((long)uVar23 < 1) {
      (pdVar26->u).p64.count = 1;
      (pdVar26->u).p64.field_6.parm1 = 0;
      goto LAB_00156783;
    }
    pkVar14 = (kmp_disp_t *)(uVar23 - 1);
    (pdVar26->u).p64.field_6.parm1 = 1;
    pkVar16 = (kmp_disp_t *)0x0;
  }
  else {
    pkVar15 = (kmp_disp_t *)(long)*(int *)(__kmp_threads[gtid]->th_pad + 0x20);
    if ((long)uVar23 < (long)uVar10) {
      pkVar14 = pkVar15;
      if ((long)pkVar15 < (long)uVar23) {
        bVar27 = (kmp_disp_t *)(uVar23 - 1) == pkVar15;
        bVar7 = true;
        pkVar16 = pkVar15;
      }
      else {
        (pdVar26->u).p64.count = 1;
        bVar27 = false;
        bVar7 = false;
      }
    }
    else {
      pkVar14 = (kmp_disp_t *)(uVar23 % uVar10);
      pkVar16 = pkVar14;
      if ((long)pkVar15 <= (long)pkVar14) {
        pkVar16 = pkVar15;
      }
      pkVar16 = (kmp_disp_t *)((long)&pkVar16->th_deo_fcn + (uVar23 / uVar10) * (long)pkVar15);
      pkVar14 = (kmp_disp_t *)
                ((long)pkVar16 + (uVar23 / uVar10 - (ulong)((long)pkVar14 <= (long)pkVar15)));
      bVar27 = (kmp_disp_t *)(uVar10 - 1) == pkVar15;
      bVar7 = true;
    }
    *(ulong *)((long)&pdVar26->u + 0x40) = (ulong)bVar27;
    if (!bVar7) goto LAB_00156783;
  }
  if (bVar28) {
    local_f8 = (kmp_disp_t *)((long)pkVar14 + (1 - (long)pkVar16));
  }
  if (st == 1) {
    (pdVar26->u).p64.lb = (long)&pkVar16->th_deo_fcn + lb;
    lVar12 = (long)&pkVar14->th_deo_fcn + lb;
  }
  else {
    lVar12 = (long)pkVar14 * st + lb;
    (pdVar26->u).p64.lb = (long)pkVar16 * st + lb;
    if (st < 1) {
      if (lVar12 + st < ub) {
        lVar12 = ub;
      }
    }
    else if (ub < lVar12 + st) {
      lVar12 = ub;
    }
  }
  (pdVar26->u).p64.ub = lVar12;
  if (pdVar26->ordered != 0) {
    (pdVar26->u).p64.ordered_lower = (kmp_uint64)pkVar16;
    (pdVar26->u).p64.ordered_upper = (kmp_uint64)pkVar14;
  }
LAB_00156783:
  pdVar26->schedule = sVar25;
  if (iVar2 == 0) {
    __kmp_wait_yield<unsigned_int>(&local_a0->buffer_index,local_110,__kmp_eq<unsigned_int>,pkVar14)
    ;
    ((pkVar4->th).th_dispatch)->th_dispatch_pr_current = pdVar26;
    ((pkVar4->th).th_dispatch)->th_dispatch_sh_current = local_a0;
    if ((pdVar26->ordered != 0) && (__kmp_itt_sync_create_ptr__3_0 != (undefined1 *)0x0)) {
      piVar6 = (__kmp_threads[gtid]->th).th_ident;
      if (piVar6 == (ident_t *)0x0) {
        pcVar19 = (char *)0x0;
      }
      else {
        pcVar19 = piVar6->psource;
      }
      (*(code *)__kmp_itt_sync_create_ptr__3_0)
                (((__kmp_threads[gtid]->th).th_dispatch)->th_dispatch_sh_current,"OMP Ordered",
                 pcVar19,0);
    }
    if (bVar28) {
      switch(sVar25) {
      case kmp_sch_static_chunked:
      case kmp_sch_static_balanced:
        sched_type = 0;
        break;
      default:
        sched_type = 3;
        break;
      case kmp_sch_dynamic_chunked:
        sched_type = 1;
        break;
      case kmp_sch_static_greedy:
        local_f8 = (kmp_disp_t *)(pdVar26->u).p64.field_6.parm1;
        sched_type = 0;
        break;
      case kmp_sch_guided_iterative_chunked:
      case kmp_sch_guided_analytical_chunked:
        sched_type = 2;
      }
      __kmp_itt_metadata_loop(loc,sched_type,uVar23,(kmp_uint64)local_f8);
    }
  }
  return;
}

Assistant:

static void
__kmp_dispatch_init(
    ident_t                        * loc,
    int                              gtid,
    enum sched_type                  schedule,
    T                                lb,
    T                                ub,
    typename traits_t< T >::signed_t st,
    typename traits_t< T >::signed_t chunk,
    int                              push_ws
) {
    typedef typename traits_t< T >::unsigned_t  UT;
    typedef typename traits_t< T >::signed_t    ST;
    typedef typename traits_t< T >::floating_t  DBL;
    static const int ___kmp_size_type = sizeof( UT );

    int                                            active;
    T                                              tc;
    kmp_info_t *                                   th;
    kmp_team_t *                                   team;
    kmp_uint32                                     my_buffer_index;
    dispatch_private_info_template< T >          * pr;
    dispatch_shared_info_template< UT > volatile * sh;

    KMP_BUILD_ASSERT( sizeof( dispatch_private_info_template< T > ) == sizeof( dispatch_private_info ) );
    KMP_BUILD_ASSERT( sizeof( dispatch_shared_info_template< UT > ) == sizeof( dispatch_shared_info ) );

    if ( ! TCR_4( __kmp_init_parallel ) )
        __kmp_parallel_initialize();

#if INCLUDE_SSC_MARKS
    SSC_MARK_DISPATCH_INIT();
#endif
    #ifdef KMP_DEBUG
    {
        const char * buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init: T#%%d called: schedule:%%d chunk:%%%s lb:%%%s ub:%%%s st:%%%s\n",
            traits_t< ST >::spec, traits_t< T >::spec, traits_t< T >::spec, traits_t< ST >::spec );
        KD_TRACE(10, ( buff, gtid, schedule, chunk, lb, ub, st ) );
        __kmp_str_free( &buff );
    }
    #endif
    /* setup data */
    th     = __kmp_threads[ gtid ];
    team   = th -> th.th_team;
    active = ! team -> t.t_serialized;
    th->th.th_ident = loc;

#if USE_ITT_BUILD
    kmp_uint64 cur_chunk = chunk;
    int itt_need_metadata_reporting = __itt_metadata_add_ptr && __kmp_forkjoin_frames_mode == 3 &&
        KMP_MASTER_GTID(gtid) &&
#if OMP_40_ENABLED
        th->th.th_teams_microtask == NULL &&
#endif
        team->t.t_active_level == 1;
#endif
    if ( ! active ) {
        pr = reinterpret_cast< dispatch_private_info_template< T >* >
            ( th -> th.th_dispatch -> th_disp_buffer ); /* top of the stack */
    } else {
        KMP_DEBUG_ASSERT( th->th.th_dispatch ==
                &th->th.th_team->t.t_dispatch[th->th.th_info.ds.ds_tid] );

        my_buffer_index = th->th.th_dispatch->th_disp_index ++;

        /* What happens when number of threads changes, need to resize buffer? */
        pr = reinterpret_cast< dispatch_private_info_template< T >  * >
            ( &th -> th.th_dispatch -> th_disp_buffer[ my_buffer_index % __kmp_dispatch_num_buffers ] );
        sh = reinterpret_cast< dispatch_shared_info_template< UT > volatile * >
            ( &team -> t.t_disp_buffer[ my_buffer_index % __kmp_dispatch_num_buffers ] );
    }

    /* Currently just ignore the monotonic and non-monotonic modifiers (the compiler isn't producing them
     * yet anyway).
     * When it is we'll want to look at them somewhere here and use that information to add to our
     * schedule choice. We shouldn't need to pass them on, they merely affect which schedule we can
     * legally choose for various dynamic cases. (In paritcular, whether or not a stealing scheme is legal).
     */
    schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);

    /* Pick up the nomerge/ordered bits from the scheduling type */
    if ( (schedule >= kmp_nm_lower) && (schedule < kmp_nm_upper) ) {
        pr->nomerge = TRUE;
        schedule = (enum sched_type)(((int)schedule) - (kmp_nm_lower - kmp_sch_lower));
    } else {
        pr->nomerge = FALSE;
    }
    pr->type_size = ___kmp_size_type; // remember the size of variables
    if ( kmp_ord_lower & schedule ) {
        pr->ordered = TRUE;
        schedule = (enum sched_type)(((int)schedule) - (kmp_ord_lower - kmp_sch_lower));
    } else {
        pr->ordered = FALSE;
    }

    if ( schedule == kmp_sch_static ) {
        schedule = __kmp_static;
    } else {
        if ( schedule == kmp_sch_runtime ) {
            // Use the scheduling specified by OMP_SCHEDULE (or __kmp_sch_default if not specified)
            schedule = team -> t.t_sched.r_sched_type;
            // Detail the schedule if needed (global controls are differentiated appropriately)
            if ( schedule == kmp_sch_guided_chunked ) {
                schedule = __kmp_guided;
            } else if ( schedule == kmp_sch_static ) {
                schedule = __kmp_static;
            }
            // Use the chunk size specified by OMP_SCHEDULE (or default if not specified)
            chunk = team -> t.t_sched.chunk;
#if USE_ITT_BUILD
            cur_chunk = chunk;
#endif
            #ifdef KMP_DEBUG
            {
                const char * buff;
                // create format specifiers before the debug output
                buff = __kmp_str_format(
                    "__kmp_dispatch_init: T#%%d new: schedule:%%d chunk:%%%s\n",
                    traits_t< ST >::spec );
                KD_TRACE(10, ( buff, gtid, schedule, chunk ) );
                __kmp_str_free( &buff );
            }
            #endif
        } else {
            if ( schedule == kmp_sch_guided_chunked ) {
                schedule = __kmp_guided;
            }
            if ( chunk <= 0 ) {
                chunk = KMP_DEFAULT_CHUNK;
            }
        }

        if ( schedule == kmp_sch_auto ) {
            // mapping and differentiation: in the __kmp_do_serial_initialize()
            schedule = __kmp_auto;
            #ifdef KMP_DEBUG
            {
                const char * buff;
                // create format specifiers before the debug output
                buff = __kmp_str_format(
                    "__kmp_dispatch_init: kmp_sch_auto: T#%%d new: schedule:%%d chunk:%%%s\n",
                    traits_t< ST >::spec );
                KD_TRACE(10, ( buff, gtid, schedule, chunk ) );
                __kmp_str_free( &buff );
            }
            #endif
        }

        /* guided analytical not safe for too many threads */
        if ( team->t.t_nproc > 1<<20 && schedule == kmp_sch_guided_analytical_chunked ) {
            schedule = kmp_sch_guided_iterative_chunked;
            KMP_WARNING( DispatchManyThreads );
        }
        pr->u.p.parm1 = chunk;
    }
    KMP_ASSERT2( (kmp_sch_lower < schedule && schedule < kmp_sch_upper),
                "unknown scheduling type" );

    pr->u.p.count = 0;

    if ( __kmp_env_consistency_check ) {
        if ( st == 0 ) {
            __kmp_error_construct(
                kmp_i18n_msg_CnsLoopIncrZeroProhibited,
                ( pr->ordered ? ct_pdo_ordered : ct_pdo ), loc
            );
        }
    }
    // compute trip count
    if ( st == 1 ) {   // most common case
        if ( ub >= lb ) {
            tc = ub - lb + 1;
        } else {   // ub < lb
            tc = 0;            // zero-trip
        }
    } else if ( st < 0 ) {
        if ( lb >= ub ) {
            // AC: cast to unsigned is needed for loops like (i=2B; i>-2B; i-=1B),
            //     where the division needs to be unsigned regardless of the result type
            tc = (UT)(lb - ub) / (-st) + 1;
        } else {   // lb < ub
            tc = 0;            // zero-trip
        }
    } else {       // st > 0
        if ( ub >= lb ) {
            // AC: cast to unsigned is needed for loops like (i=-2B; i<2B; i+=1B),
            //     where the division needs to be unsigned regardless of the result type
            tc = (UT)(ub - lb) / st + 1;
        } else {   // ub < lb
            tc = 0;            // zero-trip
        }
    }

    // Any half-decent optimizer will remove this test when the blocks are empty since the macros expand to nothing
    // when statistics are disabled.
    if (schedule == __kmp_static)
    {
        KMP_COUNT_BLOCK(OMP_FOR_static);
        KMP_COUNT_VALUE(FOR_static_iterations, tc);
    }
    else
    {
        KMP_COUNT_BLOCK(OMP_FOR_dynamic);
        KMP_COUNT_VALUE(FOR_dynamic_iterations, tc);
    }

    pr->u.p.lb = lb;
    pr->u.p.ub = ub;
    pr->u.p.st = st;
    pr->u.p.tc = tc;

    #if KMP_OS_WINDOWS
    pr->u.p.last_upper = ub + st;
    #endif /* KMP_OS_WINDOWS */

    /* NOTE: only the active parallel region(s) has active ordered sections */

    if ( active ) {
        if ( pr->ordered == 0 ) {
            th -> th.th_dispatch -> th_deo_fcn = __kmp_dispatch_deo_error;
            th -> th.th_dispatch -> th_dxo_fcn = __kmp_dispatch_dxo_error;
        } else {
            pr->ordered_bumped = 0;

            pr->u.p.ordered_lower = 1;
            pr->u.p.ordered_upper = 0;

            th -> th.th_dispatch -> th_deo_fcn = __kmp_dispatch_deo< UT >;
            th -> th.th_dispatch -> th_dxo_fcn = __kmp_dispatch_dxo< UT >;
        }
    }

    if ( __kmp_env_consistency_check ) {
        enum cons_type ws = pr->ordered ? ct_pdo_ordered : ct_pdo;
        if ( push_ws ) {
            __kmp_push_workshare( gtid, ws, loc );
            pr->pushed_ws = ws;
        } else {
            __kmp_check_workshare( gtid, ws, loc );
            pr->pushed_ws = ct_none;
        }
    }

    switch ( schedule ) {
    #if  ( KMP_STATIC_STEAL_ENABLED && KMP_ARCH_X86_64 )
    case kmp_sch_static_steal:
        {
            T nproc = team->t.t_nproc;
            T ntc, init;

            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_static_steal case\n", gtid ) );

            ntc = (tc % chunk ? 1 : 0) + tc / chunk;
            if ( nproc > 1 && ntc >= nproc ) {
                T id = __kmp_tid_from_gtid(gtid);
                T small_chunk, extras;

                small_chunk = ntc / nproc;
                extras = ntc % nproc;

                init = id * small_chunk + ( id < extras ? id : extras );
                pr->u.p.count = init;
                pr->u.p.ub = init + small_chunk + ( id < extras ? 1 : 0 );

                pr->u.p.parm2 = lb;
                //pr->pfields.parm3 = 0; // it's not used in static_steal
                pr->u.p.parm4 = id;
                pr->u.p.st = st;
                break;
            } else {
                KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to kmp_sch_static_balanced\n",
                               gtid ) );
                schedule = kmp_sch_static_balanced;
                /* too few iterations: fall-through to kmp_sch_static_balanced */
            } // if
            /* FALL-THROUGH to static balanced */
        } // case
    #endif
    case kmp_sch_static_balanced:
        {
            T nproc = team->t.t_nproc;
            T init, limit;

            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_static_balanced case\n",
                            gtid ) );

            if ( nproc > 1 ) {
                T id = __kmp_tid_from_gtid(gtid);

                if ( tc < nproc ) {
                    if ( id < tc ) {
                        init = id;
                        limit = id;
                        pr->u.p.parm1 = (id == tc - 1);  /* parm1 stores *plastiter */
                    } else {
                        pr->u.p.count = 1;  /* means no more chunks to execute */
                        pr->u.p.parm1 = FALSE;
                        break;
                    }
                } else {
                    T small_chunk = tc / nproc;
                    T extras = tc % nproc;
                    init = id * small_chunk + (id < extras ? id : extras);
                    limit = init + small_chunk - (id < extras ? 0 : 1);
                    pr->u.p.parm1 = (id == nproc - 1);
                }
            } else {
                if ( tc > 0 ) {
                    init = 0;
                    limit = tc - 1;
                    pr->u.p.parm1 = TRUE;
                } else {
                    // zero trip count
                    pr->u.p.count = 1;  /* means no more chunks to execute */
                    pr->u.p.parm1 = FALSE;
                    break;
                }
            }
#if USE_ITT_BUILD
            // Calculate chunk for metadata report
            if ( itt_need_metadata_reporting )
                cur_chunk = limit - init + 1;
#endif
            if ( st == 1 ) {
                pr->u.p.lb = lb + init;
                pr->u.p.ub = lb + limit;
            } else {
                T ub_tmp = lb + limit * st;   // calculated upper bound, "ub" is user-defined upper bound
                pr->u.p.lb = lb + init * st;
                // adjust upper bound to "ub" if needed, so that MS lastprivate will match it exactly
                if ( st > 0 ) {
                    pr->u.p.ub = ( ub_tmp + st > ub ? ub : ub_tmp );
                } else {
                    pr->u.p.ub = ( ub_tmp + st < ub ? ub : ub_tmp );
                }
            }
            if ( pr->ordered ) {
                pr->u.p.ordered_lower = init;
                pr->u.p.ordered_upper = limit;
            }
            break;
        } // case
    case kmp_sch_guided_iterative_chunked :
        {
            T nproc = team->t.t_nproc;
            KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_guided_iterative_chunked case\n",gtid));

            if ( nproc > 1 ) {
                if ( (2L * chunk + 1 ) * nproc >= tc ) {
                    /* chunk size too large, switch to dynamic */
                    schedule = kmp_sch_dynamic_chunked;
                } else {
                    // when remaining iters become less than parm2 - switch to dynamic
                    pr->u.p.parm2 = guided_int_param * nproc * ( chunk + 1 );
                    *(double*)&pr->u.p.parm3 = guided_flt_param / nproc;   // may occupy parm3 and parm4
                }
            } else {
                KD_TRACE(100,("__kmp_dispatch_init: T#%d falling-through to kmp_sch_static_greedy\n",gtid));
                schedule = kmp_sch_static_greedy;
                /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
                KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_static_greedy case\n",gtid));
                pr->u.p.parm1 = tc;
            } // if
        } // case
        break;
    case kmp_sch_guided_analytical_chunked:
        {
            T nproc = team->t.t_nproc;
            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_guided_analytical_chunked case\n", gtid));

            if ( nproc > 1 ) {
                if ( (2L * chunk + 1 ) * nproc >= tc ) {
                    /* chunk size too large, switch to dynamic */
                    schedule = kmp_sch_dynamic_chunked;
                } else {
                    /* commonly used term: (2 nproc - 1)/(2 nproc) */
                    DBL x;

                    #if KMP_OS_WINDOWS && KMP_ARCH_X86
                    /* Linux* OS already has 64-bit computation by default for
		       long double, and on Windows* OS on Intel(R) 64,
		       /Qlong_double doesn't work.  On Windows* OS
		       on IA-32 architecture, we need to set precision to
		       64-bit instead of the default 53-bit. Even though long
		       double doesn't work on Windows* OS on Intel(R) 64, the
		       resulting lack of precision is not expected to impact
		       the correctness of the algorithm, but this has not been
		       mathematically proven.
                    */
                    // save original FPCW and set precision to 64-bit, as
                    // Windows* OS on IA-32 architecture defaults to 53-bit
                    unsigned int oldFpcw = _control87(0,0);
                    _control87(_PC_64,_MCW_PC); // 0,0x30000
                    #endif
                    /* value used for comparison in solver for cross-over point */
                    long double target = ((long double)chunk * 2 + 1) * nproc / tc;

                    /* crossover point--chunk indexes equal to or greater than
		       this point switch to dynamic-style scheduling */
                    UT   cross;

                    /* commonly used term: (2 nproc - 1)/(2 nproc) */
                    x = (long double)1.0 - (long double)0.5 / nproc;

                    #ifdef KMP_DEBUG
                    { // test natural alignment
                        struct _test_a {
                            char a;
                            union {
                                char b;
                                DBL  d;
                            };
                        } t;
                        ptrdiff_t natural_alignment = (ptrdiff_t)&t.b - (ptrdiff_t)&t - (ptrdiff_t)1;
                        //__kmp_warn( " %llx %llx %lld", (long long)&t.d, (long long)&t, (long long)natural_alignment );
                        KMP_DEBUG_ASSERT( ( ( (ptrdiff_t)&pr->u.p.parm3 ) & ( natural_alignment ) ) == 0 );
                    }
                    #endif // KMP_DEBUG

                    /* save the term in thread private dispatch structure */
                    *(DBL*)&pr->u.p.parm3 = x;

                    /* solve for the crossover point to the nearest integer i for which C_i <= chunk */
                    {
                        UT          left, right, mid;
                        long double p;

                        /* estimate initial upper and lower bound */

                        /* doesn't matter what value right is as long as it is positive, but
                           it affects performance of the solver
                        */
                        right = 229;
                        p = __kmp_pow< UT >(x,right);
                        if ( p > target ) {
                            do{
                                p *= p;
                                right <<= 1;
                            } while(p>target && right < (1<<27));
                            left = right >> 1; /* lower bound is previous (failed) estimate of upper bound */
                        } else {
                            left = 0;
                        }

                        /* bisection root-finding method */
                        while ( left + 1 < right ) {
                            mid = (left + right) / 2;
                            if ( __kmp_pow< UT >(x,mid) > target ) {
                                left = mid;
                            } else {
                                right = mid;
                            }
                        } // while
                        cross = right;
                    }
                    /* assert sanity of computed crossover point */
                    KMP_ASSERT(cross && __kmp_pow< UT >(x, cross - 1) > target && __kmp_pow< UT >(x, cross) <= target);

                    /* save the crossover point in thread private dispatch structure */
                    pr->u.p.parm2 = cross;

                    // C75803
                    #if ( ( KMP_OS_LINUX || KMP_OS_WINDOWS ) && KMP_ARCH_X86 ) && ( ! defined( KMP_I8 ) )
                        #define GUIDED_ANALYTICAL_WORKAROUND (*( DBL * )&pr->u.p.parm3)
                    #else
                        #define GUIDED_ANALYTICAL_WORKAROUND (x)
                    #endif
                    /* dynamic-style scheduling offset */
                    pr->u.p.count = tc - __kmp_dispatch_guided_remaining(tc, GUIDED_ANALYTICAL_WORKAROUND, cross) - cross * chunk;
                    #if KMP_OS_WINDOWS && KMP_ARCH_X86
                        // restore FPCW
                        _control87(oldFpcw,_MCW_PC);
                    #endif
                } // if
            } else {
                KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to kmp_sch_static_greedy\n",
                               gtid ) );
                schedule = kmp_sch_static_greedy;
                /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
                pr->u.p.parm1 = tc;
            } // if
        } // case
        break;
    case kmp_sch_static_greedy:
        KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_static_greedy case\n",gtid));
            pr->u.p.parm1 = ( team -> t.t_nproc > 1 ) ?
                ( tc + team->t.t_nproc - 1 ) / team->t.t_nproc :
                tc;
        break;
    case kmp_sch_static_chunked :
    case kmp_sch_dynamic_chunked :
        if ( pr->u.p.parm1 <= 0 ) {
            pr->u.p.parm1 = KMP_DEFAULT_CHUNK;
        }
        KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_static_chunked/kmp_sch_dynamic_chunked cases\n", gtid));
        break;
    case kmp_sch_trapezoidal :
        {
            /* TSS: trapezoid self-scheduling, minimum chunk_size = parm1 */

            T parm1, parm2, parm3, parm4;
            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_trapezoidal case\n", gtid ) );

            parm1 = chunk;

            /* F : size of the first cycle */
            parm2 = ( tc / (2 * team->t.t_nproc) );

            if ( parm2 < 1 ) {
                parm2 = 1;
            }

            /* L : size of the last cycle.  Make sure the last cycle
             *     is not larger than the first cycle.
             */
            if ( parm1 < 1 ) {
                parm1 = 1;
            } else if ( parm1 > parm2 ) {
                parm1 = parm2;
            }

            /* N : number of cycles */
            parm3 = ( parm2 + parm1 );
            parm3 = ( 2 * tc + parm3 - 1) / parm3;

            if ( parm3 < 2 ) {
                parm3 = 2;
            }

            /* sigma : decreasing incr of the trapezoid */
            parm4 = ( parm3 - 1 );
            parm4 = ( parm2 - parm1 ) / parm4;

            // pointless check, because parm4 >= 0 always
            //if ( parm4 < 0 ) {
            //    parm4 = 0;
            //}

            pr->u.p.parm1 = parm1;
            pr->u.p.parm2 = parm2;
            pr->u.p.parm3 = parm3;
            pr->u.p.parm4 = parm4;
        } // case
        break;

    default:
        {
            __kmp_msg(
                kmp_ms_fatal,                        // Severity
                KMP_MSG( UnknownSchedTypeDetected ), // Primary message
                KMP_HNT( GetNewerLibrary ),          // Hint
                __kmp_msg_null                       // Variadic argument list terminator
            );
        }
        break;
    } // switch
    pr->schedule = schedule;
    if ( active ) {
        /* The name of this buffer should be my_buffer_index when it's free to use it */

        KD_TRACE(100, ("__kmp_dispatch_init: T#%d before wait: my_buffer_index:%d sh->buffer_index:%d\n",
                        gtid, my_buffer_index, sh->buffer_index) );
        __kmp_wait_yield< kmp_uint32 >( & sh->buffer_index, my_buffer_index, __kmp_eq< kmp_uint32 >
                                        USE_ITT_BUILD_ARG( NULL )
                                        );
            // Note: KMP_WAIT_YIELD() cannot be used there: buffer index and my_buffer_index are
            // *always* 32-bit integers.
        KMP_MB();  /* is this necessary? */
        KD_TRACE(100, ("__kmp_dispatch_init: T#%d after wait: my_buffer_index:%d sh->buffer_index:%d\n",
                        gtid, my_buffer_index, sh->buffer_index) );

        th -> th.th_dispatch -> th_dispatch_pr_current = (dispatch_private_info_t*) pr;
        th -> th.th_dispatch -> th_dispatch_sh_current = (dispatch_shared_info_t*)  sh;
#if USE_ITT_BUILD
        if ( pr->ordered ) {
            __kmp_itt_ordered_init( gtid );
        }; // if
        // Report loop metadata
        if ( itt_need_metadata_reporting ) {
            // Only report metadata by master of active team at level 1
            kmp_uint64 schedtype = 0;
            switch ( schedule ) {
            case kmp_sch_static_chunked:
            case kmp_sch_static_balanced:// Chunk is calculated in the switch above
                break;
            case kmp_sch_static_greedy:
                cur_chunk = pr->u.p.parm1;
                break;
            case kmp_sch_dynamic_chunked:
                schedtype = 1;
                break;
            case kmp_sch_guided_iterative_chunked:
            case kmp_sch_guided_analytical_chunked:
                schedtype = 2;
                break;
            default:
//            Should we put this case under "static"?
//            case kmp_sch_static_steal:
                schedtype = 3;
                break;
            }
            __kmp_itt_metadata_loop(loc, schedtype, tc, cur_chunk);
        }
#endif /* USE_ITT_BUILD */
    }; // if

    #ifdef KMP_DEBUG
    {
        const char * buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init: T#%%d returning: schedule:%%d ordered:%%%s lb:%%%s ub:%%%s" \
            " st:%%%s tc:%%%s count:%%%s\n\tordered_lower:%%%s ordered_upper:%%%s" \
            " parm1:%%%s parm2:%%%s parm3:%%%s parm4:%%%s\n",
            traits_t< UT >::spec, traits_t< T >::spec, traits_t< T >::spec,
            traits_t< ST >::spec, traits_t< UT >::spec, traits_t< UT >::spec,
            traits_t< UT >::spec, traits_t< UT >::spec, traits_t< T >::spec,
            traits_t< T >::spec, traits_t< T >::spec, traits_t< T >::spec );
        KD_TRACE(10, ( buff,
            gtid, pr->schedule, pr->ordered, pr->u.p.lb, pr->u.p.ub,
            pr->u.p.st, pr->u.p.tc, pr->u.p.count,
            pr->u.p.ordered_lower, pr->u.p.ordered_upper, pr->u.p.parm1,
            pr->u.p.parm2, pr->u.p.parm3, pr->u.p.parm4 ) );
        __kmp_str_free( &buff );
    }
    #endif
    #if ( KMP_STATIC_STEAL_ENABLED )
    if ( ___kmp_size_type < 8 ) {
      // It cannot be guaranteed that after execution of a loop with some other schedule kind
      // all the parm3 variables will contain the same value.
      // Even if all parm3 will be the same, it still exists a bad case like using 0 and 1
      // rather than program life-time increment.
      // So the dedicated variable is required. The 'static_steal_counter' is used.
      if( schedule == kmp_sch_static_steal ) {
        // Other threads will inspect this variable when searching for a victim.
        // This is a flag showing that other threads may steal from this thread since then.
        volatile T * p = &pr->u.p.static_steal_counter;
        *p = *p + 1;
      }
    }
    #endif // ( KMP_STATIC_STEAL_ENABLED && USE_STEALING )

#if OMPT_SUPPORT && OMPT_TRACE
    if (ompt_enabled &&
        ompt_callbacks.ompt_callback(ompt_event_loop_begin)) {
        ompt_team_info_t *team_info = __ompt_get_teaminfo(0, NULL);
        ompt_task_info_t *task_info = __ompt_get_taskinfo(0);
        ompt_callbacks.ompt_callback(ompt_event_loop_begin)(
            team_info->parallel_id, task_info->task_id, team_info->microtask);
    }
#endif
}